

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O3

int __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_infohashes_sample
          (dht_default_storage *this,entry *item)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__args;
  pointer *ppdVar2;
  iterator __position;
  uint uVar3;
  _Base_ptr p_Var4;
  size_t sVar5;
  undefined4 uVar6;
  entry *peVar7;
  time_point tVar8;
  long lVar9;
  _Base_ptr p_Var10;
  uint uVar11;
  uint uVar12;
  pointer pdVar13;
  uint uVar14;
  ulong uVar15;
  string_view key;
  string_view key_00;
  string_view key_01;
  span<const_char> v;
  
  uVar11 = this->m_settings->sample_infohashes_interval;
  if (0x545f < (int)uVar11) {
    uVar11 = 0x5460;
  }
  uVar15 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar15 = 0;
  }
  key.len_ = 8;
  key.ptr_ = "interval";
  peVar7 = entry::operator[](item,key);
  entry::operator=(peVar7,uVar15);
  sVar5 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  key_00.len_ = 3;
  key_00.ptr_ = "num";
  peVar7 = entry::operator[](item,key_00);
  entry::operator=(peVar7,(long)(int)sVar5);
  tVar8 = aux::time_now();
  uVar11 = this->m_settings->sample_infohashes_interval;
  uVar14 = this->m_settings->max_infohashes_sample_count;
  uVar12 = 0x14;
  if ((int)uVar14 < 0x14) {
    uVar12 = uVar14;
  }
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  uVar14 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((int)uVar12 < (int)uVar14) {
    uVar14 = uVar12;
  }
  if (0 < (int)uVar11) {
    uVar3 = 0x5460;
    if (uVar11 < 0x5460) {
      uVar3 = uVar11;
    }
    if ((long)tVar8.__d.__r <
        (long)((ulong)uVar3 * 1000000000 + (this->m_infohashes_sample).created.__d.__r)) {
      pdVar13 = (this->m_infohashes_sample).samples.
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = (long)(this->m_infohashes_sample).samples.
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar13;
      if ((int)uVar12 <= (int)(uVar15 >> 2) * -0x33333333) goto LAB_00349458;
    }
  }
  pdVar13 = (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_infohashes_sample).samples.
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar13) {
    (this->m_infohashes_sample).samples.
    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar13;
  }
  std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::reserve
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
             &this->m_infohashes_sample,(long)(int)uVar14);
  p_Var10 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var1) {
    uVar11 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      if (uVar14 == 0) break;
      lVar9 = random((libtorrent *)(ulong)uVar11);
      if ((uint)lVar9 <= uVar14) {
        __args = p_Var10 + 1;
        __position._M_current =
             (this->m_infohashes_sample).samples.
             super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
             super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
          _M_realloc_insert<libtorrent::digest32<160l>const&>
                    ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                      *)&this->m_infohashes_sample,__position,(digest32<160L> *)__args);
        }
        else {
          ((__position._M_current)->m_number)._M_elems[4] = *(uint *)&p_Var10[1]._M_left;
          uVar6 = *(undefined4 *)&__args->field_0x4;
          p_Var4 = p_Var10[1]._M_parent;
          ((__position._M_current)->m_number)._M_elems[0] = __args->_M_color;
          ((__position._M_current)->m_number)._M_elems[1] = uVar6;
          *(_Base_ptr *)(((__position._M_current)->m_number)._M_elems + 2) = p_Var4;
          ppdVar2 = &(this->m_infohashes_sample).samples.
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppdVar2 = *ppdVar2 + 1;
        }
        uVar14 = uVar14 - 1;
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      uVar11 = uVar11 - 1;
    } while ((_Rb_tree_header *)p_Var10 != p_Var1);
  }
  (this->m_infohashes_sample).created.__d.__r = (rep)tVar8.__d.__r;
  pdVar13 = (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar15 = (long)(this->m_infohashes_sample).samples.
                 super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar13;
LAB_00349458:
  key_01.len_ = 7;
  key_01.ptr_ = "samples";
  peVar7 = entry::operator[](item,key_01);
  v.m_len = uVar15;
  v.m_ptr = (char *)pdVar13;
  entry::operator=(peVar7,v);
  return (int)((ulong)((long)(this->m_infohashes_sample).samples.
                             super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             .
                             super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_infohashes_sample).samples.
                            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            .
                            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333;
}

Assistant:

int get_infohashes_sample(entry& item) override
		{
			item["interval"] = aux::clamp(m_settings.sample_infohashes_interval
				, 0, sample_infohashes_interval_max);
			item["num"] = int(m_map.size());

			refresh_infohashes_sample();

			aux::vector<sha1_hash> const& samples = m_infohashes_sample.samples;
			item["samples"] = span<char const>(
				reinterpret_cast<char const*>(samples.data()), static_cast<std::ptrdiff_t>(samples.size()) * 20);

			return m_infohashes_sample.count();
		}